

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_zip.c
# Opt level: O0

int ZIPVGetField(TIFF *tif,uint32_t tag,__va_list_tag *ap)

{
  undefined4 uVar1;
  uint uVar2;
  uint8_t *puVar3;
  int iVar4;
  undefined8 *local_70;
  undefined8 *local_50;
  ZIPState *sp;
  __va_list_tag *ap_local;
  uint32_t tag_local;
  TIFF *tif_local;
  
  puVar3 = tif->tif_data;
  if (tag == 0x10015) {
    uVar1 = *(undefined4 *)(puVar3 + 0xf0);
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_50 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_50 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_50 + 1;
    }
    *(undefined4 *)*local_50 = uVar1;
  }
  else {
    if (tag != 0x10022) {
      iVar4 = (**(code **)(puVar3 + 0x100))(tif,tag,ap);
      return iVar4;
    }
    uVar1 = *(undefined4 *)(puVar3 + 0xf8);
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_70 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_70 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_70 + 1;
    }
    *(undefined4 *)*local_70 = uVar1;
  }
  return 1;
}

Assistant:

static int ZIPVGetField(TIFF *tif, uint32_t tag, va_list ap)
{
    ZIPState *sp = ZState(tif);

    switch (tag)
    {
        case TIFFTAG_ZIPQUALITY:
            *va_arg(ap, int *) = sp->zipquality;
            break;

        case TIFFTAG_DEFLATE_SUBCODEC:
            *va_arg(ap, int *) = sp->subcodec;
            break;

        default:
            return (*sp->vgetparent)(tif, tag, ap);
    }
    return (1);
}